

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testsc.c
# Opt level: O2

void test_ecc_montgomery_multiply(void)

{
  MontgomeryCurve *mc;
  mp_int *x;
  size_t sVar1;
  MontgomeryPoint *src;
  MontgomeryPoint *pMVar2;
  size_t i;
  ulong index;
  
  mc = mcurve();
  x = mp_new(0x38);
  pMVar2 = (MontgomeryPoint *)0x0;
  for (index = 0; sVar1 = (*looplimit)(7), index < sVar1; index = index + 1) {
    src = mpoint(mc,index);
    if (pMVar2 != (MontgomeryPoint *)0x0) {
      ecc_montgomery_point_copy_into(pMVar2,src);
      ecc_montgomery_point_free(src);
      src = pMVar2;
    }
    mp_random_fill(x);
    log_start();
    pMVar2 = ecc_montgomery_multiply(src,x);
    log_end();
    ecc_montgomery_point_free(pMVar2);
    pMVar2 = src;
  }
  ecc_montgomery_point_free(pMVar2);
  ecc_montgomery_curve_free(mc);
  mp_free(x);
  return;
}

Assistant:

static void test_ecc_montgomery_multiply(void)
{
    MontgomeryCurve *wc = mcurve();
    MontgomeryPoint *a = NULL;
    mp_int *exponent = mp_new(56);
    for (size_t i = 0; i < looplimit(7); i++) {
        MontgomeryPoint *A = mpoint(wc, i);
        if (!a) {
            a = A;
        } else {
            ecc_montgomery_point_copy_into(a, A);
            ecc_montgomery_point_free(A);
        }
        mp_random_fill(exponent);

        log_start();
        MontgomeryPoint *r = ecc_montgomery_multiply(a, exponent);
        log_end();

        ecc_montgomery_point_free(r);
    }
    ecc_montgomery_point_free(a);
    ecc_montgomery_curve_free(wc);
    mp_free(exponent);
}